

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

void __thiscall
cs::compiler_type::trim_expr
          (compiler_type *this,tree_type<cs::token_base_*> *tree,iterator it,trim_type do_trim)

{
  value_type *__x;
  pointer pcVar1;
  tree_type<cs::token_base_*> *ptVar2;
  tree_node *__n;
  instance_type *this_00;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  value_type *pvVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  token_base **pptVar9;
  token_base *ptVar10;
  token_id *this_01;
  undefined4 extraout_var;
  iterator iVar11;
  undefined4 extraout_var_00;
  token_base *ptVar12;
  pointer pbVar13;
  undefined4 extraout_var_01;
  undefined8 *puVar14;
  object_method *this_02;
  token_value *ptVar15;
  internal_error *this_03;
  runtime_error *this_04;
  compile_error *pcVar16;
  compiler_type *pcVar17;
  _func_int **pp_Var18;
  tree_type<cs::token_base_*> *ptVar19;
  string *name;
  iterator size;
  Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>,_0UL,_false>
  id;
  iterator *this_05;
  undefined4 uVar20;
  tree_type<cs::token_base_*> *tree_2;
  value_type *__x_00;
  tree_type<cs::token_base_*> *ptVar21;
  value_type *pvVar22;
  tree_type<cs::token_base_*> *tree_1;
  _func_int **pp_Var23;
  Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>,_0UL,_false>
  SVar24;
  tree_type<cs::token_base_*> *lst;
  size_t sVar25;
  CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
  CVar26;
  initializer_list<cs::tree_type<cs::token_base_*>_> __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<cs::statement_base_*> __l_01;
  function func;
  var lambda;
  token_base *token;
  iterator local_220;
  compiler_type *local_218;
  undefined1 local_210 [136];
  token_base *local_188;
  undefined4 local_17c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158;
  any local_140;
  any local_138;
  token_base *local_130;
  size_t local_128;
  _func_int **local_120;
  size_t local_118;
  undefined1 local_110;
  undefined7 uStack_10f;
  size_t sStack_108;
  context_t local_100;
  _func_int **local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_d0;
  _Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  local_80;
  
  if (it.mData == (tree_node *)0x0) {
    return;
  }
  ptVar19 = tree;
  local_220.mData = it.mData;
  local_218 = this;
  pptVar9 = tree_type<cs::token_base_*>::iterator::data(&local_220);
  ptVar10 = *pptVar9;
  if (ptVar10 == (token_base *)0x0) {
    return;
  }
  local_130 = ptVar10;
  iVar8 = (*ptVar10->_vptr_token_base[2])(ptVar10);
  pcVar17 = local_218;
  if (0xb < iVar8) {
    if (iVar8 == 0xc) {
      if (do_trim == no_expr_fold) {
        return;
      }
      pptVar9 = tree_type<cs::token_base_*>::iterator::data(&local_220);
      ptVar10 = *pptVar9 + 1;
      trim_expr(local_218,(tree_type<cs::token_base_*> *)ptVar10,
                (tree_node *)(*pptVar9)[1]._vptr_token_base,do_trim);
      tree_type<cs::token_base_*>::merge(tree,local_220,(tree_type<cs::token_base_*> *)ptVar10);
      return;
    }
    if (iVar8 == 0xe) {
      ptVar19 = (tree_type<cs::token_base_*> *)ptVar10[2]._vptr_token_base;
      ptVar2 = (tree_type<cs::token_base_*> *)ptVar10[4]._vptr_token_base;
      if (ptVar19 == ptVar2) {
        return;
      }
      ptVar21 = (tree_type<cs::token_base_*> *)ptVar10[3]._vptr_token_base;
      sVar25 = ptVar10[3].line_num;
      do {
        trim_expr(local_218,ptVar19,ptVar19->mRoot,do_trim);
        ptVar19 = ptVar19 + 1;
        if (ptVar19 == ptVar21) {
          ptVar19 = *(tree_type<cs::token_base_*> **)(sVar25 + 8);
          sVar25 = sVar25 + 8;
          ptVar21 = ptVar19 + 0x40;
        }
      } while (ptVar19 != ptVar2);
      return;
    }
    goto switchD_00165ba8_caseD_f;
  }
  if (iVar8 != 3) {
    if (iVar8 == 4) {
      if (do_trim == no_this_deduce) {
        return;
      }
      name = (string *)(ptVar10 + 3);
      bVar6 = domain_manager::exist_record
                        (&(((((local_218->context).
                              super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->instance).
                            super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           )->super_runtime_type).storage,name);
      if (bVar6) {
        return;
      }
      bVar6 = domain_manager::exist_record_in_struct
                        (&(((((local_218->context).
                              super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->instance).
                            super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           )->super_runtime_type).storage,name);
      if (!bVar6) {
        return;
      }
      ptVar10 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)name);
      ptVar10->line_num = 1;
      ptVar10->_vptr_token_base = (_func_int **)&PTR__token_base_0024f068;
      *(undefined4 *)&ptVar10[1]._vptr_token_base = 0xe;
      pptVar9 = tree_type<cs::token_base_*>::iterator::data(&local_220);
      *pptVar9 = ptVar10;
      size.mData = local_220.mData;
      tree_type<cs::token_base*>::emplace_left_left<cs::token_base*&>
                ((tree_type<cs::token_base*> *)tree,local_220,&local_130);
      iVar11.mData = local_220.mData;
      this_01 = (token_id *)token_base::operator_new((token_base *)0x50,(size_t)size.mData);
      local_210._16_4_ = 0x73696874;
      local_210._8_8_ = (tree_node *)0x4;
      local_210._20_4_ = local_210._20_4_ & 0xffffff00;
      local_210._0_8_ = local_210 + 0x10;
      token_id::token_id(this_01,(string *)local_210);
      local_178.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)this_01;
      tree_type<cs::token_base*>::emplace_left_left<cs::token_id*>
                ((tree_type<cs::token_base*> *)tree,iVar11,(token_id **)&local_178);
      if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
        operator_delete((void *)local_210._0_8_,CONCAT44(local_210._20_4_,local_210._16_4_) + 1);
      }
      tree_type<cs::token_base*>::emplace_right_right<cs::token_base*&>
                ((tree_type<cs::token_base*> *)tree,local_220,&local_130);
      return;
    }
    goto switchD_00165ba8_caseD_f;
  }
  iVar8 = *(int *)&ptVar10[1]._vptr_token_base;
  switch(iVar8) {
  case 0xd:
    iVar11 = tree_type<cs::token_base_*>::iterator::left(&local_220);
    pcVar17 = local_218;
    trim_expr(local_218,tree,iVar11,no_expr_fold);
    iVar11 = tree_type<cs::token_base_*>::iterator::right(&local_220);
    trim_expr(pcVar17,tree,iVar11,no_expr_fold);
    local_210._0_8_ = tree_type<cs::token_base_*>::iterator::left(&local_220);
    pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_210);
    ptVar10 = *pptVar9;
    local_210._0_8_ = tree_type<cs::token_base_*>::iterator::right(&local_220);
    pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_210);
    ptVar12 = *pptVar9;
    if (ptVar10 == (token_base *)0x0 && ptVar12 == (token_base *)0x0) {
      pptVar9 = tree_type<cs::token_base_*>::iterator::data(&local_220);
      *pptVar9 = (token_base *)0x0;
      return;
    }
    if (ptVar10 == (token_base *)0x0) {
      ptVar10 = (token_base *)token_base::operator_new((token_base *)0x60,(size_t)tree);
      ptVar10->line_num = 1;
      ptVar10->_vptr_token_base = (_func_int **)&PTR__token_parallel_0024f248;
      ptVar10[1]._vptr_token_base = (_func_int **)0x0;
      ptVar10[1].line_num = 0;
      ptVar10[2]._vptr_token_base = (_func_int **)0x0;
      ptVar10[2].line_num = 0;
      ptVar10[3]._vptr_token_base = (_func_int **)0x0;
      ptVar10[3].line_num = 0;
      ptVar10[4]._vptr_token_base = (_func_int **)0x0;
      ptVar10[4].line_num = 0;
      ptVar10[5]._vptr_token_base = (_func_int **)0x0;
      ptVar10[5].line_num = 0;
      std::
      _Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
      ::_M_initialize_map((_Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                           *)(ptVar10 + 1),0);
    }
    else {
      iVar8 = (*ptVar10->_vptr_token_base[2])(ptVar10);
      if (iVar8 != 0xf) {
        ptVar10 = (token_base *)token_base::operator_new((token_base *)0x60,(size_t)tree);
        iVar11 = tree_type<cs::token_base_*>::iterator::left(&local_220);
        iVar8 = tree_type<cs::token_base_*>::copy((EVP_PKEY_CTX *)iVar11.mData,(EVP_PKEY_CTX *)0x0);
        local_210._0_8_ = CONCAT44(extraout_var_00,iVar8);
        __l._M_len = 1;
        __l._M_array = (iterator)local_210;
        std::
        deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
        deque((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
               *)&local_80,__l,(allocator_type *)&local_178);
        ptVar10->line_num = 1;
        ptVar10->_vptr_token_base = (_func_int **)&PTR__token_parallel_0024f248;
        std::
        _Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
        ::_Deque_base((_Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                       *)(ptVar10 + 1),&local_80);
        std::
        deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
        ~deque((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                *)&local_80);
        tree_type<cs::token_base_*>::destroy((tree_node *)local_210._0_8_);
      }
    }
    local_188 = ptVar10;
    if (ptVar12 != (token_base *)0x0) {
      iVar8 = (*ptVar12->_vptr_token_base[2])(ptVar12);
      if (iVar8 == 0xf) {
        __x_00 = (value_type *)ptVar12[2]._vptr_token_base;
        pvVar5 = (value_type *)ptVar12[4]._vptr_token_base;
        if (__x_00 != pvVar5) {
          pvVar22 = (value_type *)ptVar12[3]._vptr_token_base;
          sVar25 = ptVar12[3].line_num;
          ptVar10 = local_188 + 1;
          do {
            std::
            deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
            ::push_back((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                         *)ptVar10,__x_00);
            __x_00 = __x_00 + 1;
            if (__x_00 == pvVar22) {
              __x_00 = *(value_type **)(sVar25 + 8);
              sVar25 = sVar25 + 8;
              pvVar22 = __x_00 + 0x40;
            }
          } while (__x_00 != pvVar5);
        }
      }
      else {
        ptVar10 = local_188 + 1;
        local_210._0_8_ = tree_type<cs::token_base_*>::iterator::right(&local_220);
        std::deque<cs::tree_type<cs::token_base*>,std::allocator<cs::tree_type<cs::token_base*>>>::
        emplace_back<cs::tree_type<cs::token_base*>::iterator>
                  ((deque<cs::tree_type<cs::token_base*>,std::allocator<cs::tree_type<cs::token_base*>>>
                    *)ptVar10,(iterator *)local_210);
      }
    }
    ptVar19 = (tree_type<cs::token_base_*> *)local_188[2]._vptr_token_base;
    ptVar2 = (tree_type<cs::token_base_*> *)local_188[4]._vptr_token_base;
    if (ptVar19 != ptVar2) {
      ptVar21 = (tree_type<cs::token_base_*> *)local_188[3]._vptr_token_base;
      sVar25 = local_188[3].line_num;
      do {
        trim_expr(local_218,ptVar19,ptVar19->mRoot,do_trim);
        ptVar19 = ptVar19 + 1;
        if (ptVar19 == ptVar21) {
          ptVar19 = *(tree_type<cs::token_base_*> **)(sVar25 + 8);
          sVar25 = sVar25 + 8;
          ptVar21 = ptVar19 + 0x40;
        }
      } while (ptVar19 != ptVar2);
    }
    pptVar9 = tree_type<cs::token_base_*>::iterator::data(&local_220);
    *pptVar9 = local_188;
    return;
  case 0xe:
    iVar11 = tree_type<cs::token_base_*>::iterator::left(&local_220);
    trim_expr(local_218,tree,iVar11,do_trim);
    local_210._0_8_ = tree_type<cs::token_base_*>::iterator::right(&local_220);
    pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_210);
    if ((*pptVar9 != (token_base *)0x0) &&
       (iVar8 = (*(*pptVar9)->_vptr_token_base[2])(), iVar8 == 4)) {
      return;
    }
    pcVar16 = (compile_error *)__cxa_allocate_exception(0x28);
    local_210._0_8_ = local_210 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_210,"Wrong grammar for dot expression.","");
    compile_error::compile_error(pcVar16,(string *)local_210);
    __cxa_throw(pcVar16,&compile_error::typeinfo,compile_error::~compile_error);
  case 0xf:
  case 0x10:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x26:
  case 0x28:
  case 0x2f:
  case 0x30:
    break;
  case 0x11:
    local_210._0_8_ = tree_type<cs::token_base_*>::iterator::left(&local_220);
    pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_210);
    if (*pptVar9 == (token_base *)0x0) {
LAB_00167198:
      pcVar16 = (compile_error *)__cxa_allocate_exception(0x28);
      local_210._0_8_ = local_210 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_210,"Wrong grammar for assign expression.","");
      compile_error::compile_error(pcVar16,(string *)local_210);
      __cxa_throw(pcVar16,&compile_error::typeinfo,compile_error::~compile_error);
    }
    local_178.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)tree_type<cs::token_base_*>::iterator::right(&local_220);
    pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_178);
    if (*pptVar9 == (token_base *)0x0) goto LAB_00167198;
    iVar11 = tree_type<cs::token_base_*>::iterator::left(&local_220);
    ptVar19 = tree;
    trim_expr(local_218,tree,iVar11,do_trim);
    local_210._0_8_ = tree_type<cs::token_base_*>::iterator::left(&local_220);
    pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_210);
    iVar8 = (*(*pptVar9)->_vptr_token_base[2])();
    if (iVar8 == 0xf) {
      ptVar10 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)ptVar19);
      ptVar10->line_num = 1;
      ptVar10->_vptr_token_base = (_func_int **)&PTR__token_base_0024f068;
      *(undefined4 *)&ptVar10[1]._vptr_token_base = 0x35;
      pptVar9 = tree_type<cs::token_base_*>::iterator::data(&local_220);
      *pptVar9 = ptVar10;
    }
    goto LAB_00166573;
  case 0x19:
    local_210._0_8_ = tree_type<cs::token_base_*>::iterator::left(&local_220);
    pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_210);
    if (*pptVar9 != (token_base *)0x0) {
      pcVar16 = (compile_error *)__cxa_allocate_exception(0x28);
      local_210._0_8_ = local_210 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_210,"Wrong grammar for not expression.","");
      compile_error::compile_error(pcVar16,(string *)local_210);
      __cxa_throw(pcVar16,&compile_error::typeinfo,compile_error::~compile_error);
    }
    break;
  case 0x1d:
    local_210._0_8_ = tree_type<cs::token_base_*>::iterator::right(&local_220);
    pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_210);
    ptVar10 = *pptVar9;
    if (((ptVar10 == (token_base *)0x0) ||
        (ptVar10->_vptr_token_base != (_func_int **)&PTR__token_base_0024f068)) ||
       (*(int *)&ptVar10[1]._vptr_token_base != 0x1c)) {
      pcVar16 = (compile_error *)__cxa_allocate_exception(0x28);
      local_210._0_8_ = local_210 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_210,"Wrong grammar for choice expression.","");
      compile_error::compile_error(pcVar16,(string *)local_210);
      __cxa_throw(pcVar16,&compile_error::typeinfo,compile_error::~compile_error);
    }
    iVar11 = tree_type<cs::token_base_*>::iterator::left(&local_220);
    pcVar17 = local_218;
    trim_expr(local_218,tree,iVar11,do_trim);
    local_210._0_8_ = tree_type<cs::token_base_*>::iterator::right(&local_220);
    iVar11 = tree_type<cs::token_base_*>::iterator::left((iterator *)local_210);
    trim_expr(pcVar17,tree,iVar11,do_trim);
    local_210._0_8_ = tree_type<cs::token_base_*>::iterator::right(&local_220);
    this_05 = (iterator *)local_210;
    goto LAB_0016681a;
  case 0x25:
    iVar11 = tree_type<cs::token_base_*>::iterator::left(&local_220);
    pcVar17 = local_218;
    trim_expr(local_218,tree,iVar11,do_trim);
    iVar11 = tree_type<cs::token_base_*>::iterator::right(&local_220);
    trim_expr(pcVar17,tree,iVar11,do_trim);
    local_210._0_8_ = tree_type<cs::token_base_*>::iterator::left(&local_220);
    pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_210);
    ptVar10 = *pptVar9;
    local_210._0_8_ = tree_type<cs::token_base_*>::iterator::right(&local_220);
    pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_210);
    if ((((pcVar17->inside_lambda != true) || (ptVar10 != (token_base *)0x0)) ||
        (ptVar10 = *pptVar9, ptVar10 == (token_base *)0x0)) ||
       (iVar8 = (*ptVar10->_vptr_token_base[2])(ptVar10), iVar8 != 0xd)) {
      pcVar16 = (compile_error *)__cxa_allocate_exception(0x28);
      local_210._0_8_ = local_210 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_210,"Wrong grammar for lambda expression.","");
      compile_error::compile_error(pcVar16,(string *)local_210);
      __cxa_throw(pcVar16,&compile_error::typeinfo,compile_error::~compile_error);
    }
    goto LAB_00166791;
  case 0x27:
    iVar11 = tree_type<cs::token_base_*>::iterator::left(&local_220);
    pcVar17 = local_218;
    trim_expr(local_218,tree,iVar11,do_trim);
    iVar11 = tree_type<cs::token_base_*>::iterator::right(&local_220);
    trim_expr(pcVar17,tree,iVar11,do_trim);
    local_210._0_8_ = tree_type<cs::token_base_*>::iterator::left(&local_220);
    pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_210);
    ptVar10 = *pptVar9;
    local_210._0_8_ = tree_type<cs::token_base_*>::iterator::right(&local_220);
    pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_210);
    if (((ptVar10 != (token_base *)0x0) && (*pptVar9 != (token_base *)0x0)) &&
       (iVar8 = (*(*pptVar9)->_vptr_token_base[2])(), iVar8 == 0xd)) {
      return;
    }
    pcVar16 = (compile_error *)__cxa_allocate_exception(0x28);
    local_210._0_8_ = local_210 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_210,"Wrong syntax for function call.","");
    compile_error::compile_error(pcVar16,(string *)local_210);
    __cxa_throw(pcVar16,&compile_error::typeinfo,compile_error::~compile_error);
  case 0x29:
    local_210._0_8_ = tree_type<cs::token_base_*>::iterator::left(&local_220);
    pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_210);
    if (*pptVar9 != (token_base *)0x0) {
      pcVar16 = (compile_error *)__cxa_allocate_exception(0x28);
      local_210._0_8_ = local_210 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_210,"Wrong grammar for typeid expression.","");
      compile_error::compile_error(pcVar16,(string *)local_210);
      __cxa_throw(pcVar16,&compile_error::typeinfo,compile_error::~compile_error);
    }
    break;
  case 0x2a:
    local_210._0_8_ = tree_type<cs::token_base_*>::iterator::left(&local_220);
    pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_210);
    if (*pptVar9 != (token_base *)0x0) {
      pcVar16 = (compile_error *)__cxa_allocate_exception(0x28);
      local_210._0_8_ = local_210 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_210,"Wrong grammar for addr expression.","");
      compile_error::compile_error(pcVar16,(string *)local_210);
      __cxa_throw(pcVar16,&compile_error::typeinfo,compile_error::~compile_error);
    }
    break;
  case 0x2b:
    local_210._0_8_ = tree_type<cs::token_base_*>::iterator::left(&local_220);
    pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_210);
    if (*pptVar9 != (token_base *)0x0) {
      pcVar16 = (compile_error *)__cxa_allocate_exception(0x28);
      local_210._0_8_ = local_210 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_210,"Wrong grammar for new expression.","");
      compile_error::compile_error(pcVar16,(string *)local_210);
      __cxa_throw(pcVar16,&compile_error::typeinfo,compile_error::~compile_error);
    }
    break;
  case 0x2c:
    local_210._0_8_ = tree_type<cs::token_base_*>::iterator::left(&local_220);
    pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_210);
    if (*pptVar9 != (token_base *)0x0) {
      pcVar16 = (compile_error *)__cxa_allocate_exception(0x28);
      local_210._0_8_ = local_210 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_210,"Wrong grammar for gcnew expression.","");
      compile_error::compile_error(pcVar16,(string *)local_210);
      __cxa_throw(pcVar16,&compile_error::typeinfo,compile_error::~compile_error);
    }
LAB_00166573:
    iVar11 = tree_type<cs::token_base_*>::iterator::right(&local_220);
    pcVar17 = local_218;
    goto LAB_00166822;
  case 0x2d:
    local_210._0_8_ = tree_type<cs::token_base_*>::iterator::left(&local_220);
    pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_210);
    if (*pptVar9 == (token_base *)0x0) {
LAB_001670ec:
      pcVar16 = (compile_error *)__cxa_allocate_exception(0x28);
      local_210._0_8_ = local_210 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_210,"Wrong grammar for arrow expression.","");
      compile_error::compile_error(pcVar16,(string *)local_210);
      __cxa_throw(pcVar16,&compile_error::typeinfo,compile_error::~compile_error);
    }
    local_178.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)tree_type<cs::token_base_*>::iterator::right(&local_220);
    pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_178);
    if (*pptVar9 == (token_base *)0x0) goto LAB_001670ec;
    local_158.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)tree_type<cs::token_base_*>::iterator::right(&local_220);
    pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_158);
    iVar8 = (*(*pptVar9)->_vptr_token_base[2])();
    if (iVar8 != 4) goto LAB_001670ec;
    iVar11 = tree_type<cs::token_base_*>::iterator::left(&local_220);
    pcVar17 = local_218;
    goto LAB_00166822;
  case 0x2e:
    local_218->inside_lambda = true;
    iVar11 = tree_type<cs::token_base_*>::iterator::left(&local_220);
    trim_expr(pcVar17,tree,iVar11,do_trim);
    pcVar17->inside_lambda = false;
    local_210._0_8_ = tree_type<cs::token_base_*>::iterator::left(&local_220);
    pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_210);
    ptVar10 = *pptVar9;
    iVar11 = tree_type<cs::token_base_*>::iterator::right(&local_220);
    trim_expr(pcVar17,tree,iVar11,no_this_deduce);
    local_210._0_8_ = tree_type<cs::token_base_*>::iterator::right(&local_220);
    pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_210);
    if (((ptVar10 == (token_base *)0x0) || (*pptVar9 == (token_base *)0x0)) ||
       (iVar8 = (*ptVar10->_vptr_token_base[2])(ptVar10), iVar8 != 0xd)) {
      pcVar16 = (compile_error *)__cxa_allocate_exception(0x28);
      local_210._0_8_ = local_210 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_210,"Wrong grammar for lambda expression.","");
      compile_error::compile_error(pcVar16,(string *)local_210);
      __cxa_throw(pcVar16,&compile_error::typeinfo,compile_error::~compile_error);
    }
    local_178.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_178.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_178.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pp_Var18 = ptVar10[2]._vptr_token_base;
    pp_Var23 = ptVar10[4]._vptr_token_base;
    if (pp_Var18 == pp_Var23) {
      local_17c = 0;
    }
    else {
      ptVar12 = (token_base *)ptVar10[3]._vptr_token_base;
      local_128 = ptVar10[3].line_num;
      local_17c = 0;
      local_f0 = pp_Var23;
      do {
        local_210._0_8_ = *pp_Var18;
        pcVar17 = (compiler_type *)local_210;
        pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_210);
        if (*pptVar9 == (token_base *)0x0) {
          this_03 = (internal_error *)__cxa_allocate_exception(0x28);
          local_210._0_8_ = local_210 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_210,"Null pointer accessed.","");
          internal_error::internal_error(this_03,(string *)local_210);
          __cxa_throw(this_03,&internal_error::typeinfo,internal_error::~internal_error);
        }
        try_fix_this_deduction(pcVar17,(tree_node *)*pp_Var18);
        local_210._0_8_ = *pp_Var18;
        pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_210);
        iVar8 = (*(*pptVar9)->_vptr_token_base[2])();
        if (iVar8 == 4) {
          local_210._0_8_ = *pp_Var18;
          local_188 = ptVar12;
          pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_210);
          pbVar13 = local_178.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          __x = (value_type *)(*pptVar9 + 3);
          if (local_178.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_178.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            __n = (tree_node *)(*pptVar9)[3].line_num;
            CVar26.
            super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>,_0UL,_false>
            .value = (Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>,_0UL,_false>
                      )(Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>,_0UL,_false>
                        )local_178.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            do {
              if ((*(tree_node **)
                    ((long)CVar26.
                           super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>,_0UL,_false>
                           .value + 8) == __n) &&
                 ((__n == (tree_node *)0x0 ||
                  (iVar8 = bcmp(*(void **)CVar26.
                                          super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>,_0UL,_false>
                                          .value,(__x->_M_dataplus)._M_p,(size_t)__n), iVar8 == 0)))
                 ) {
                pcVar16 = (compile_error *)__cxa_allocate_exception(0x28);
                local_210._0_8_ = local_210 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_210,"Redefinition of function argument.","");
                compile_error::compile_error(pcVar16,(string *)local_210);
                __cxa_throw(pcVar16,&compile_error::typeinfo,compile_error::~compile_error);
              }
              CVar26.
              super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>,_0UL,_false>
              .value = (Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>,_0UL,_false>
                        )((long)CVar26.
                                super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>,_0UL,_false>
                                .value + 0x20);
            } while (CVar26.
                     super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>,_0UL,_false>
                     .value != (Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>,_0UL,_false>
                                )pbVar13);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_178,__x);
          ptVar12 = local_188;
          pp_Var23 = local_f0;
        }
        else {
          local_210._0_8_ = *pp_Var18;
          pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_210);
          iVar8 = (*(*pptVar9)->_vptr_token_base[2])();
          if (iVar8 != 5) {
            pcVar16 = (compile_error *)__cxa_allocate_exception(0x28);
            local_210._0_8_ = local_210 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_210,"Unexpected element in function argument list.","");
            compile_error::compile_error(pcVar16,(string *)local_210);
            __cxa_throw(pcVar16,&compile_error::typeinfo,compile_error::~compile_error);
          }
          local_210._0_8_ = *pp_Var18;
          pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_210);
          if (local_178.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_178.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            pcVar16 = (compile_error *)__cxa_allocate_exception(0x28);
            local_210._0_8_ = local_210 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_210,
                       "Redefinition of function argument(Multi-define of vargs).","");
            compile_error::compile_error(pcVar16,(string *)local_210);
            __cxa_throw(pcVar16,&compile_error::typeinfo,compile_error::~compile_error);
          }
          local_17c = (undefined4)CONCAT71((int7)((ulong)pptVar9 >> 8),1);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_178,(value_type *)(*pptVar9 + 1));
        }
        pp_Var18 = pp_Var18 + 1;
        if ((token_base *)pp_Var18 == ptVar12) {
          pp_Var18 = *(_func_int ***)(local_128 + 8);
          local_128 = local_128 + 8;
          ptVar12 = (token_base *)(pp_Var18 + 0x40);
        }
      } while (pp_Var18 != pp_Var23);
    }
    iVar11 = tree_type<cs::token_base_*>::iterator::right(&local_220);
    pcVar1 = local_210 + 0x10;
    local_210._16_4_ = 0x666c6573;
    local_210._8_8_ = (tree_node *)0x4;
    local_210._20_4_ = local_210._20_4_ & 0xffffff00;
    id.value = (T)local_210;
    local_210._0_8_ = pcVar1;
    cVar7 = find_id_ref(iVar11,(string *)id.value);
    if ((pointer)local_210._0_8_ != pcVar1) {
      id.value = CONCAT44(local_210._20_4_,local_210._16_4_) + 1;
      operator_delete((void *)local_210._0_8_,id.value);
    }
    if (((~cVar7 | (byte)local_17c) & 1) == 0) {
      local_210._16_4_ = 0x666c6573;
      local_210._8_8_ = (tree_node *)0x4;
      local_210._20_4_ = local_210._20_4_ & 0xffffff00;
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)local_210;
      local_210._0_8_ = pcVar1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_158,__l_00,(allocator_type *)&local_140);
      if ((pointer)local_210._0_8_ != pcVar1) {
        operator_delete((void *)local_210._0_8_,CONCAT44(local_210._20_4_,local_210._16_4_) + 1);
      }
      id.value = (long)local_178.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_178.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve(&local_158,id.value);
      pbVar13 = local_178.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      CVar26.
      super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>,_0UL,_false>
      .value = (Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>,_0UL,_false>
                )(Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>,_0UL,_false>
                  )local_178.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      SVar24.value = (T)local_178.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
      if (local_178.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_178.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_188 = (token_base *)CONCAT71(local_188._1_7_,cVar7);
        CVar26.
        super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>,_0UL,_false>
        .value = (Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>,_0UL,_false>
                  )(Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>,_0UL,_false>
                    )local_178.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        do {
          iVar8 = std::__cxx11::string::compare
                            ((char *)CVar26.
                                     super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>,_0UL,_false>
                                     .value);
          if (iVar8 == 0) {
            this_04 = (runtime_error *)__cxa_allocate_exception(0x28);
            local_210._0_8_ = pcVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_210,"Overwrite the default argument \"self\".","");
            runtime_error::runtime_error(this_04,(string *)local_210);
            __cxa_throw(this_04,&runtime_error::typeinfo,runtime_error::~runtime_error);
          }
          id = CVar26.
               super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>,_0UL,_false>
               .value;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_158
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CVar26.
                      super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>,_0UL,_false>
                      .value);
          CVar26.
          super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>,_0UL,_false>
          .value = (Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>,_0UL,_false>
                    )((long)CVar26.
                            super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>,_0UL,_false>
                            .value + 0x20);
        } while (CVar26.
                 super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>,_0UL,_false>
                 .value != (Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>,_0UL,_false>
                            )pbVar13);
        CVar26.
        super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>,_0UL,_false>
        .value = (Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>,_0UL,_false>
                  )(Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>,_0UL,_false>
                    )local_178.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        SVar24.value = (T)local_178.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
        cVar7 = (char)local_188;
      }
      pbVar13 = local_158.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_158.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_178.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_178.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_158.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_178.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_158.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_178.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar13;
      local_158.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)SVar24.value;
      local_158.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)CVar26.
                    super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>,_0UL,_false>
                    .value;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_158);
    }
    pbVar13 = (pointer)statement_base::operator_new((statement_base *)0x28,id.value);
    iVar11 = tree_type<cs::token_base_*>::iterator::right(&local_220);
    sVar25 = 0;
    iVar8 = tree_type<cs::token_base_*>::copy((EVP_PKEY_CTX *)iVar11.mData,(EVP_PKEY_CTX *)0x0);
    peVar3 = (local_218->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var4 = (local_218->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
    }
    puVar14 = (undefined8 *)token_base::operator_new((token_base *)0x10,sVar25);
    sVar25 = local_130->line_num;
    puVar14[1] = sVar25;
    *puVar14 = &PTR__token_base_0024d040;
    pbVar13->_M_string_length = (size_type)peVar3;
    (pbVar13->field_2)._M_allocated_capacity = (size_type)p_Var4;
    *(size_t *)((long)&pbVar13->field_2 + 8) = sVar25;
    (pbVar13->_M_dataplus)._M_p = (pointer)&PTR__statement_return_00254990;
    pbVar13[1]._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_01,iVar8);
    local_100.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (local_218->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_100.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (local_218->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_100.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_100.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_100.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_100.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_100.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi)->_M_use_count + 1;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_e8,&local_178);
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)&local_158;
    local_158.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = pbVar13;
    std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
              ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_d0,
               __l_01,(allocator_type *)&local_140);
    cs::function::function
              ((function *)local_210,&local_100,&local_e8,
               (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_d0,
               (bool)((byte)local_17c & 1),true);
    std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
              (&local_d0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_e8);
    if (local_100.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_100.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (cVar7 == '\0') {
      cs_impl::any::make_protect<cs::callable,cs::function&>
                ((any *)&local_158,(function *)local_210);
      ptVar15 = new_value(local_218,(var *)&local_158);
      pptVar9 = tree_type<cs::token_base_*>::iterator::data(&local_220);
    }
    else {
      local_140.mDat = (proxy *)0x0;
      cs_impl::any::make_protect<cs::callable,cs::function&>(&local_138,(function *)local_210);
      cs_impl::any::make<cs::object_method,cs_impl::any,cs_impl::any>
                ((any *)&local_158,&local_140,&local_138);
      cs_impl::any::recycle(&local_138);
      cs_impl::any::recycle(&local_140);
      this_02 = cs_impl::any::val<cs::object_method>((any *)&local_158);
      if ((pointer)(this_02->object).mDat !=
          local_158.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        cs_impl::any::recycle(&this_02->object);
        if (local_158.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          (local_158.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_string_length =
               (local_158.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_string_length + 1;
        }
        (this_02->object).mDat =
             (proxy *)local_158.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
      }
      cs_impl::any::protect((any *)&local_158);
      ptVar15 = new_value(local_218,(var *)&local_158);
      pptVar9 = tree_type<cs::token_base_*>::iterator::data(&local_220);
    }
    *pptVar9 = &ptVar15->super_token_base;
    cs_impl::any::recycle((any *)&local_158);
    cs::function::~function((function *)local_210);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_178);
    return;
  case 0x31:
    local_210._0_8_ = tree_type<cs::token_base_*>::iterator::left(&local_220);
    pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_210);
    if (*pptVar9 != (token_base *)0x0) {
      pcVar16 = (compile_error *)__cxa_allocate_exception(0x28);
      local_210._0_8_ = local_210 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_210,"Wrong grammar for variable declaration.","");
      compile_error::compile_error(pcVar16,(string *)local_210);
      __cxa_throw(pcVar16,&compile_error::typeinfo,compile_error::~compile_error);
    }
    iVar11 = tree_type<cs::token_base_*>::iterator::right(&local_220);
    trim_expr(local_218,tree,iVar11,no_this_deduce);
    local_210._0_8_ = tree_type<cs::token_base_*>::iterator::right(&local_220);
    pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_210);
    ptVar10 = *pptVar9;
    if ((ptVar10 == (token_base *)0x0) ||
       (iVar8 = (*ptVar10->_vptr_token_base[2])(ptVar10), iVar8 != 4)) {
      pcVar16 = (compile_error *)__cxa_allocate_exception(0x28);
      local_210._0_8_ = local_210 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_210,"Wrong grammar for variable declaration.","");
      compile_error::compile_error(pcVar16,(string *)local_210);
      __cxa_throw(pcVar16,&compile_error::typeinfo,compile_error::~compile_error);
    }
    domain_manager::add_record
              (&(((((local_218->context).
                    super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->super_runtime_type).storage,(string *)(ptVar10 + 3));
    goto LAB_001666b9;
  case 0x32:
    local_210._0_8_ = tree_type<cs::token_base_*>::iterator::left(&local_220);
    pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_210);
    if (*pptVar9 != (token_base *)0x0) {
      pcVar16 = (compile_error *)__cxa_allocate_exception(0x28);
      local_210._0_8_ = local_210 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_210,"Wrong grammar for variable declaration.","");
      compile_error::compile_error(pcVar16,(string *)local_210);
      __cxa_throw(pcVar16,&compile_error::typeinfo,compile_error::~compile_error);
    }
    iVar11 = tree_type<cs::token_base_*>::iterator::right(&local_220);
    pcVar17 = local_218;
    trim_expr(local_218,tree,iVar11,no_this_deduce);
    this_00 = (((pcVar17->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    iVar11 = tree_type<cs::token_base_*>::iterator::right(&local_220);
    instance_type::check_declar_var(this_00,iVar11,true);
    goto LAB_00166776;
  case 0x33:
    local_210._0_8_ = tree_type<cs::token_base_*>::iterator::left(&local_220);
    pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_210);
    if (*pptVar9 != (token_base *)0x0) {
      pcVar16 = (compile_error *)__cxa_allocate_exception(0x28);
      local_210._0_8_ = local_210 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_210,"Wrong grammar for variable declaration.","");
      compile_error::compile_error(pcVar16,(string *)local_210);
      __cxa_throw(pcVar16,&compile_error::typeinfo,compile_error::~compile_error);
    }
    iVar11 = tree_type<cs::token_base_*>::iterator::right(&local_220);
    trim_expr(local_218,tree,iVar11,no_this_deduce);
LAB_00166776:
    local_210._0_8_ = tree_type<cs::token_base_*>::iterator::right(&local_220);
    pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_210);
    ptVar10 = *pptVar9;
LAB_00166791:
    pptVar9 = tree_type<cs::token_base_*>::iterator::data(&local_220);
    *pptVar9 = ptVar10;
    return;
  case 0x34:
    local_210._0_8_ = tree_type<cs::token_base_*>::iterator::left(&local_220);
    pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_210);
    if (*pptVar9 == (token_base *)0x0) {
      local_210._0_8_ = tree_type<cs::token_base_*>::iterator::right(&local_220);
      pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_210);
      ptVar10 = *pptVar9;
      if ((ptVar10 == (token_base *)0x0) ||
         (iVar8 = (*ptVar10->_vptr_token_base[2])(ptVar10), iVar8 != 4)) {
        pcVar16 = (compile_error *)__cxa_allocate_exception(0x28);
        local_210._0_8_ = local_210 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_210,"Wrong grammar for vargs expression.","");
        compile_error::compile_error(pcVar16,(string *)local_210);
        __cxa_throw(pcVar16,&compile_error::typeinfo,compile_error::~compile_error);
      }
      ptVar12 = (token_base *)token_base::operator_new((token_base *)0x30,(size_t)ptVar19);
      local_120 = (_func_int **)&local_110;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_120,ptVar10[3]._vptr_token_base,
                 ptVar10[3].line_num + (long)ptVar10[3]._vptr_token_base);
      ptVar12->line_num = 1;
      ptVar12->_vptr_token_base = (_func_int **)&PTR__token_vargs_0024f430;
      ptVar12[1]._vptr_token_base = (_func_int **)(ptVar12 + 2);
      if (local_120 == (_func_int **)&local_110) {
        ptVar12[2]._vptr_token_base = (_func_int **)CONCAT71(uStack_10f,local_110);
        ptVar12[2].line_num = sStack_108;
      }
      else {
        ptVar12[1]._vptr_token_base = local_120;
        ptVar12[2]._vptr_token_base = (_func_int **)CONCAT71(uStack_10f,local_110);
      }
      ptVar12[1].line_num = local_118;
      local_118 = 0;
      local_110 = 0;
      local_120 = (_func_int **)&local_110;
      pptVar9 = tree_type<cs::token_base_*>::iterator::data(&local_220);
      *pptVar9 = ptVar12;
      if (local_120 == (_func_int **)&local_110) {
        return;
      }
      operator_delete(local_120,CONCAT71(uStack_10f,local_110) + 1);
      return;
    }
    local_210._0_8_ = tree_type<cs::token_base_*>::iterator::right(&local_220);
    pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_210);
    if (*pptVar9 != (token_base *)0x0) {
      pcVar16 = (compile_error *)__cxa_allocate_exception(0x28);
      local_210._0_8_ = local_210 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_210,"Wrong grammar for vargs expression.","");
      compile_error::compile_error(pcVar16,(string *)local_210);
      __cxa_throw(pcVar16,&compile_error::typeinfo,compile_error::~compile_error);
    }
    iVar11 = tree_type<cs::token_base_*>::iterator::left(&local_220);
    trim_expr(local_218,tree,iVar11,do_trim);
    ptVar10 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)tree);
    iVar11 = tree_type<cs::token_base_*>::iterator::left(&local_220);
    iVar8 = tree_type<cs::token_base_*>::copy((EVP_PKEY_CTX *)iVar11.mData,(EVP_PKEY_CTX *)0x0);
    ptVar10->line_num = 1;
    ptVar10->_vptr_token_base = (_func_int **)&PTR__token_expand_0024f0f0;
    ptVar10[1]._vptr_token_base = (_func_int **)CONCAT44(extraout_var,iVar8);
LAB_001666b9:
    pptVar9 = tree_type<cs::token_base_*>::iterator::data(&local_220);
    *pptVar9 = ptVar10;
    return;
  default:
    if (iVar8 == 3) {
      local_210._0_8_ = tree_type<cs::token_base_*>::iterator::left(&local_220);
      pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_210);
      if (*pptVar9 == (token_base *)0x0) {
        uVar20 = 0x30;
LAB_001667c1:
        ptVar10 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)ptVar19);
        ptVar10->line_num = 1;
        ptVar10->_vptr_token_base = (_func_int **)&PTR__token_base_0024f068;
        *(undefined4 *)&ptVar10[1]._vptr_token_base = uVar20;
        pptVar9 = tree_type<cs::token_base_*>::iterator::data(&local_220);
        *pptVar9 = ptVar10;
      }
    }
    else if (iVar8 == 5) {
      local_210._0_8_ = tree_type<cs::token_base_*>::iterator::left(&local_220);
      pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_210);
      if (*pptVar9 == (token_base *)0x0) {
        uVar20 = 0x2f;
        goto LAB_001667c1;
      }
    }
  }
switchD_00165ba8_caseD_f:
  this_05 = &local_220;
  iVar11 = tree_type<cs::token_base_*>::iterator::left(this_05);
  pcVar17 = local_218;
  trim_expr(local_218,tree,iVar11,do_trim);
LAB_0016681a:
  iVar11 = tree_type<cs::token_base_*>::iterator::right(this_05);
LAB_00166822:
  trim_expr(pcVar17,tree,iVar11,do_trim);
  return;
}

Assistant:

void
	compiler_type::trim_expr(tree_type<token_base *> &tree, tree_type<token_base *>::iterator it, trim_type do_trim)
	{
		if (!it.usable())
			return;
		token_base *token = it.data();
		if (token == nullptr)
			return;
		switch (token->get_type()) {
		default:
			break;
		case token_types::id: {
			if (do_trim != trim_type::no_this_deduce) {
				const std::string &id = static_cast<token_id *>(token)->get_id();
				if (!context->instance->storage.exist_record(id) &&
				        context->instance->storage.exist_record_in_struct(id)) {
					it.data() = new token_signal(signal_types::dot_);
					tree.emplace_left_left(it, token);
					tree.emplace_left_left(it, new token_id("this"));
					tree.emplace_right_right(it, token);
				}
			}
			return;
		}
		case token_types::expr: {
			if (do_trim != trim_type::no_expr_fold) {
				tree_type<token_base *> &t = static_cast<token_expr *>(it.data())->get_tree();
				trim_expression(t, do_trim);
				tree.merge(it, t);
			}
			return;
		}
		case token_types::array: {
			for (auto &tree: static_cast<token_array *>(token)->get_array())
				trim_expression(tree, do_trim);
			return;
		}
		case token_types::signal: {
			switch (static_cast<token_signal *>(token)->get_signal()) {
			default:
				break;
			case signal_types::addr_:
				if (it.left().data() != nullptr)
					throw compile_error("Wrong grammar for addr expression.");
				break;
			case signal_types::new_:
				if (it.left().data() != nullptr)
					throw compile_error("Wrong grammar for new expression.");
				break;
			case signal_types::gcnew_:
				if (it.left().data() != nullptr)
					throw compile_error("Wrong grammar for gcnew expression.");
				trim_expr(tree, it.right(), do_trim);
				return;
				break;
			case signal_types::typeid_:
				if (it.left().data() != nullptr)
					throw compile_error("Wrong grammar for typeid expression.");
				break;
			case signal_types::not_:
				if (it.left().data() != nullptr)
					throw compile_error("Wrong grammar for not expression.");
				break;
			case signal_types::sub_:
				if (it.left().data() == nullptr)
					it.data() = new token_signal(signal_types::minus_);
				break;
			case signal_types::mul_:
				if (it.left().data() == nullptr)
					it.data() = new token_signal(signal_types::escape_);
				break;
			case signal_types::asi_:
				if (it.left().data() == nullptr || it.right().data() == nullptr)
					throw compile_error("Wrong grammar for assign expression.");
				trim_expr(tree, it.left(), do_trim);
				if (it.left().data()->get_type() == token_types::parallel)
					it.data() = new token_signal(signal_types::bind_);
				trim_expr(tree, it.right(), do_trim);
				return;
			case signal_types::com_: {
				trim_expr(tree, it.left(), trim_type::no_expr_fold);
				trim_expr(tree, it.right(), trim_type::no_expr_fold);
				token_base *lptr = it.left().data();
				token_base *rptr = it.right().data();
				if (lptr == nullptr && rptr == nullptr)
					it.data() = nullptr;
				else {
					token_parallel *parallel_list = nullptr;
					if (lptr != nullptr && lptr->get_type() == token_types::parallel)
						parallel_list = static_cast<token_parallel *>(lptr);
					else if (lptr != nullptr)
						parallel_list = new token_parallel({tree_type<token_base *>(it.left())});
					else
						parallel_list = new token_parallel();
					if (rptr != nullptr && rptr->get_type() == token_types::parallel)
						for (auto &tree: static_cast<token_parallel *>(rptr)->get_parallel())
							parallel_list->get_parallel().push_back(tree);
					else if (rptr != nullptr)
						parallel_list->get_parallel().emplace_back(it.right());
					for (auto &lst: parallel_list->get_parallel())
						trim_expr(lst, lst.root(), do_trim);
					it.data() = parallel_list;
				}
				return;
			}
			case signal_types::choice_: {
				token_signal *sig = dynamic_cast<token_signal *>(it.right().data());
				if (sig == nullptr || sig->get_signal() != signal_types::pair_)
					throw compile_error("Wrong grammar for choice expression.");
				trim_expr(tree, it.left(), do_trim);
				trim_expr(tree, it.right().left(), do_trim);
				trim_expr(tree, it.right().right(), do_trim);
				return;
			}
			case signal_types::vardef_: {
				if (it.left().data() != nullptr)
					throw compile_error("Wrong grammar for variable declaration.");
				trim_expr(tree, it.right(), trim_type::no_this_deduce);
				token_base *rptr = it.right().data();
				if (rptr == nullptr || rptr->get_type() != token_types::id)
					throw compile_error("Wrong grammar for variable declaration.");
				context->instance->storage.add_record(static_cast<token_id *>(rptr)->get_id());
				it.data() = rptr;
				return;
			}
			case signal_types::varchk_: {
				if (it.left().data() != nullptr)
					throw compile_error("Wrong grammar for variable declaration.");
				trim_expr(tree, it.right(), trim_type::no_this_deduce);
				context->instance->check_declar_var(it.right(), true);
				it.data() = it.right().data();
				return;
			}
			case signal_types::varprt_: {
				if (it.left().data() != nullptr)
					throw compile_error("Wrong grammar for variable declaration.");
				trim_expr(tree, it.right(), trim_type::no_this_deduce);
				it.data() = it.right().data();
				return;
			}
			case signal_types::arrow_:
				if (it.left().data() == nullptr || it.right().data() == nullptr ||
				        it.right().data()->get_type() != token_types::id)
					throw compile_error("Wrong grammar for arrow expression.");
				trim_expr(tree, it.left(), do_trim);
				return;
			case signal_types::dot_: {
				trim_expr(tree, it.left(), do_trim);
				token_base *rptr = it.right().data();
				if (rptr == nullptr || rptr->get_type() != token_types::id)
					throw compile_error("Wrong grammar for dot expression.");
				return;
			}
			case signal_types::fcall_: {
				trim_expr(tree, it.left(), do_trim);
				trim_expr(tree, it.right(), do_trim);
				token_base *lptr = it.left().data();
				token_base *rptr = it.right().data();
				if (lptr == nullptr || rptr == nullptr || rptr->get_type() != token_types::arglist)
					throw compile_error("Wrong syntax for function call.");
				return;
			}
			case signal_types::vargs_: {
				if (it.left().data() == nullptr) {
					token_base *rptr = it.right().data();
					if (rptr == nullptr || rptr->get_type() != token_types::id)
						throw compile_error("Wrong grammar for vargs expression.");
					it.data() = new token_vargs(static_cast<token_id *>(rptr)->get_id());
				}
				else {
					if (it.right().data() != nullptr)
						throw compile_error("Wrong grammar for vargs expression.");
					trim_expr(tree, it.left(), do_trim);
					it.data() = new token_expand(tree_type<token_base *>(it.left()));
				}
				return;
			}
			case signal_types::emb_: {
				trim_expr(tree, it.left(), do_trim);
				trim_expr(tree, it.right(), do_trim);
				token_base *lptr = it.left().data();
				token_base *rptr = it.right().data();
				if (!inside_lambda || lptr != nullptr || rptr == nullptr ||
				        rptr->get_type() != token_types::arglist)
					throw compile_error("Wrong grammar for lambda expression.");
				it.data() = rptr;
				return;
			}
			case signal_types::lambda_: {
				inside_lambda = true;
				trim_expr(tree, it.left(), do_trim);
				inside_lambda = false;
				token_base *lptr = it.left().data();
				trim_expr(tree, it.right(), trim_type::no_this_deduce);
				token_base *rptr = it.right().data();
				if (lptr == nullptr || rptr == nullptr || lptr->get_type() != token_types::arglist)
					throw compile_error("Wrong grammar for lambda expression.");
				std::vector<std::string> args;
				bool is_vargs = false;
				for (auto &item: static_cast<token_arglist *>(lptr)->get_arglist()) {
					if (item.root().data() == nullptr)
						throw internal_error("Null pointer accessed.");
					try_fix_this_deduction(item.root());
					if (item.root().data()->get_type() == token_types::id) {
						const std::string &str = static_cast<token_id *>(item.root().data())->get_id();
						for (auto &it: args)
							if (it == str)
								throw compile_error("Redefinition of function argument.");
						args.push_back(str);
					}
					else if (item.root().data()->get_type() == token_types::vargs) {
						const std::string &str = static_cast<token_vargs *>(item.root().data())->get_id();
						if (!args.empty())
							throw compile_error("Redefinition of function argument(Multi-define of vargs).");
						args.push_back(str);
						is_vargs = true;
					}
					else
						throw compile_error("Unexpected element in function argument list.");
				}
				bool find_self_ref = find_id_ref(it.right(), "self");
				if (!is_vargs && find_self_ref) {
					std::vector<std::string> new_args{"self"};
					new_args.reserve(args.size());
					for (auto &name: args) {
						if (name != "self")
							new_args.emplace_back(std::move(name));
						else
							throw runtime_error("Overwrite the default argument \"self\".");
					}
					std::swap(new_args, args);
				}
				statement_base *ret = new statement_return(tree_type<token_base *>(it.right()), context,
				        new token_endline(token->get_line_num()));
#ifdef CS_DEBUGGER
				std::string decl="function [lambda](";
				if(args.size()!=0) {
					for(auto& it:args)
						decl+=it+", ";
					decl.pop_back();
					decl[decl.size()-1]=')';
				}
				else
					decl+=")";
				function func(context, decl, ret, args, std::deque<statement_base *> {ret}, is_vargs, true);
#else
				function func(context, args, std::deque<statement_base *> {ret}, is_vargs, true);
#endif
				if (find_self_ref) {
					var lambda = var::make<object_method>(var(), var::make_protect<callable>(func));
					lambda.val<object_method>().object = lambda;
					lambda.protect();
					it.data() = new_value(lambda);
				}
				else
					it.data() = new_value(var::make_protect<callable>(func));
				return;
			}
			}
		}
		}
		trim_expr(tree, it.left(), do_trim);
		trim_expr(tree, it.right(), do_trim);
	}